

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_ObjDup(Bac_Ntk_t *pNew,Bac_Ntk_t *p,int i)

{
  Bac_ObjType_t Type;
  int iVar1;
  int iVar2;
  undefined4 local_34;
  int iObj;
  int i_local;
  Bac_Ntk_t *p_local;
  Bac_Ntk_t *pNew_local;
  
  Type = Bac_ObjType(p,i);
  iVar1 = Bac_ObjIsBox(p,i);
  if (iVar1 == 0) {
    local_34 = -1;
  }
  else {
    local_34 = Bac_BoxNtkId(p,i);
  }
  iVar1 = Bac_ObjAlloc(pNew,Type,local_34);
  iVar2 = Bac_NtkHasNames(p);
  if (iVar2 != 0) {
    iVar2 = Bac_NtkHasNames(pNew);
    if (iVar2 != 0) {
      iVar2 = Bac_ObjIsCo(p,i);
      if (iVar2 == 0) {
        iVar2 = Bac_ObjName(p,i);
        Bac_ObjSetName(pNew,iVar1,iVar2);
      }
    }
  }
  Bac_ObjSetCopy(p,i,iVar1);
  return iVar1;
}

Assistant:

static inline int Bac_ObjDup( Bac_Ntk_t * pNew, Bac_Ntk_t * p, int i )
{
    int iObj = Bac_ObjAlloc( pNew, Bac_ObjType(p, i), Bac_ObjIsBox(p, i) ? Bac_BoxNtkId(p, i) : -1 );
    if ( Bac_NtkHasNames(p) && Bac_NtkHasNames(pNew) && !Bac_ObjIsCo(p, i) ) 
        Bac_ObjSetName( pNew, iObj, Bac_ObjName(p, i) );
    Bac_ObjSetCopy( p, i, iObj );
    return iObj;
}